

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

void __thiscall
QStyledItemDelegate::setModelData
          (QStyledItemDelegate *this,QWidget *editor,QAbstractItemModel *model,QModelIndex *index)

{
  long lVar1;
  QArrayData *pQVar2;
  undefined1 *puVar3;
  Data *pDVar4;
  uint uVar5;
  char *pcVar6;
  QItemEditorFactory *pQVar7;
  long in_FS_OFFSET;
  QArrayData *local_98;
  char *pcStack_90;
  undefined1 *local_88;
  QByteArray local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (*(code *)**(undefined8 **)editor)(editor);
  QMetaObject::userProperty();
  pcVar6 = (char *)QMetaProperty::name();
  QByteArray::QByteArray(&local_78,pcVar6,-1);
  if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
    pQVar7 = *(QItemEditorFactory **)(lVar1 + 0x78);
    if (pQVar7 == (QItemEditorFactory *)0x0) {
      pQVar7 = QItemEditorFactory::defaultFactory();
    }
    (**(code **)(*(long *)model + 0x90))(&local_58,model,index,2);
    uVar5 = ::QVariant::typeId(&local_58);
    (*pQVar7->_vptr_QItemEditorFactory[3])(&local_98,pQVar7,(ulong)uVar5);
    pcVar6 = local_78.d.ptr;
    pDVar4 = local_78.d.d;
    puVar3 = local_88;
    pQVar2 = local_98;
    local_98 = &(local_78.d.d)->super_QArrayData;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = pcStack_90;
    pcStack_90 = pcVar6;
    local_88 = (undefined1 *)local_78.d.size;
    local_78.d.size = (qsizetype)puVar3;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,1,0x10);
      }
    }
    ::QVariant::~QVariant(&local_58);
    if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) goto LAB_0055ee1d;
  }
  QObject::property((char *)&local_58);
  (**(code **)(*(long *)model + 0x98))(model,index,&local_58,2);
  ::QVariant::~QVariant(&local_58);
LAB_0055ee1d:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::setModelData(QWidget *editor,
                                 QAbstractItemModel *model,
                                 const QModelIndex &index) const
{
    Q_D(const QStyledItemDelegate);
    Q_ASSERT(model);
    Q_ASSERT(editor);
    QByteArray n = editor->metaObject()->userProperty().name();
    if (n.isEmpty())
        n = d->editorFactory()->valuePropertyName(
            model->data(index, Qt::EditRole).userType());
    if (!n.isEmpty())
        model->setData(index, editor->property(n), Qt::EditRole);
}